

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void vmwrite_(PDISASM pMyDisasm)

{
  char *pcVar1;
  UInt8 UVar2;
  _Bool _Var3;
  undefined8 uVar4;
  bool bVar5;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    UVar2 = (pMyDisasm->Reserved_).VEX.pp;
    if (UVar2 == '\x03') {
      (pMyDisasm->Instruction).Category = 0x140000;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vcvtsd2usi",0xb);
      (pMyDisasm->Reserved_).EVEX.tupletype = '\b';
      bVar5 = (pMyDisasm->Reserved_).EVEX.W == '\x01';
      (pMyDisasm->Reserved_).MemDecoration = bVar5 + 0x67;
      (pMyDisasm->Reserved_).OperandSize = (uint)bVar5 * 0x20 + 0x20;
    }
    else {
      if (UVar2 != '\x02') {
        if (UVar2 == '\x01') {
          pcVar1 = (pMyDisasm->Instruction).Mnemonic;
          if ((pMyDisasm->Reserved_).EVEX.W != '\x01') {
            (pMyDisasm->Reserved_).EVEX.tupletype = '\x02';
            builtin_strncpy(pcVar1,"vcvtps2uqq",0xb);
            vex_GEx(pMyDisasm,0x68,0x6d,0x6e);
            return;
          }
          (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
          builtin_strncpy(pcVar1,"vcvtpd2uqq",0xb);
        }
        else {
          UVar2 = (pMyDisasm->Reserved_).EVEX.W;
          (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
          if (UVar2 == '\x01') {
            uVar4 = 0x7532647074766376;
          }
          else {
            uVar4 = 0x7532737074766376;
          }
          *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar4;
          (pMyDisasm->Instruction).Mnemonic[7] = 'u';
          (pMyDisasm->Instruction).Mnemonic[8] = 'd';
          (pMyDisasm->Instruction).Mnemonic[9] = 'q';
          (pMyDisasm->Instruction).Mnemonic[10] = '\0';
        }
        vex_GxEx(pMyDisasm);
        return;
      }
      (pMyDisasm->Instruction).Category = 0x140000;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vcvtss2usi",0xb);
      (pMyDisasm->Reserved_).EVEX.tupletype = '\a';
      (pMyDisasm->Reserved_).MemDecoration = 0x67;
      (pMyDisasm->Reserved_).OperandSize =
           (uint)((pMyDisasm->Reserved_).EVEX.W == '\x01') * 0x20 + 0x20;
    }
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).Register_ = 4;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
    return;
  }
  if (((pMyDisasm->Reserved_).VEX.state != '\x01') && (_Var3 = prefixes_present(pMyDisasm), !_Var3))
  {
    (pMyDisasm->Instruction).Category = 0xb0000;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmwrite",8);
    if ((pMyDisasm->Reserved_).Architecture == 0x40) {
      (pMyDisasm->Reserved_).OperandSize = 0x40;
    }
    GvEv(pMyDisasm);
    if ((pMyDisasm->Reserved_).Architecture != 0x40) {
      return;
    }
    (pMyDisasm->Reserved_).OperandSize = 0x20;
    return;
  }
  failDecode(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ vmwrite_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 1) {
        GV.EVEX.tupletype = FULL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvtpd2uqq");
        #endif
        vex_GxEx(pMyDisasm);
      }
      else {
        GV.EVEX.tupletype = HALF;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvtps2uqq");
        #endif
        vex_GEx(pMyDisasm, Arg2qword, Arg2_m128_xmm, Arg2_m256_ymm);
      }
    }
    else if (GV.VEX.pp == 2) {
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvtss2usi");
      #endif
      GV.EVEX.tupletype = TUPLE1_FIXED__32;
      GV.MemDecoration = Arg2dword;
      GV.OperandSize = (GV.EVEX.W == 1) ? 64 : 32;
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = SSE_REG;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
    else if (GV.VEX.pp == 3) {
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvtsd2usi");
      #endif
      GV.EVEX.tupletype = TUPLE1_FIXED__64;
      GV.MemDecoration = (GV.EVEX.W == 1) ? Arg2qword : Arg2dword;
      GV.OperandSize = (GV.EVEX.W == 1) ? 64 : 32;
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = SSE_REG;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
    else {
      if (GV.EVEX.W == 1) {
        GV.EVEX.tupletype = FULL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvtpd2udq");
        #endif
        vex_GxEx(pMyDisasm);
      }
      else {
        GV.EVEX.tupletype = FULL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vcvtps2udq");
        #endif
        vex_GxEx(pMyDisasm);
      }
    }
  }
  else if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  }
  else {
    if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
    pMyDisasm->Instruction.Category = VM_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmwrite");
    #endif
    if (GV.Architecture == 64) GV.OperandSize = 64;
    GvEv(pMyDisasm);
    if (GV.Architecture == 64) GV.OperandSize = 32;
  }
}